

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::getDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  uint16_t *puVar4;
  uint16_t *mapping;
  UChar *decomp;
  uint16_t norm16;
  int32_t *length_local;
  UChar *buffer_local;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  if ((int)(uint)(ushort)this->minDecompNoCP <= c) {
    decomp._6_2_ = getNorm16(this,c);
    UVar2 = isMaybeOrNonZeroCC(this,decomp._6_2_);
    if (UVar2 == '\0') {
      mapping = (uint16_t *)0x0;
      UVar2 = isDecompNoAlgorithmic(this,decomp._6_2_);
      buffer_local._4_4_ = c;
      if (UVar2 != '\0') {
        buffer_local._4_4_ = mapAlgorithmic(this,c,decomp._6_2_);
        *length = 0;
        if (buffer_local._4_4_ < 0x10000) {
          iVar1 = *length;
          *length = iVar1 + 1;
          buffer[iVar1] = (UChar)buffer_local._4_4_;
        }
        else {
          iVar1 = *length;
          *length = iVar1 + 1;
          buffer[iVar1] = (short)((int)buffer_local._4_4_ >> 10) + L'ퟀ';
          iVar1 = *length;
          *length = iVar1 + 1;
          buffer[iVar1] = (UChar)buffer_local._4_4_ & 0x3ffU | 0xdc00;
        }
        decomp._6_2_ = getRawNorm16(this,buffer_local._4_4_);
        mapping = (uint16_t *)buffer;
      }
      if (decomp._6_2_ < this->minYesNo) {
        return (UChar *)mapping;
      }
      UVar2 = isHangulLV(this,decomp._6_2_);
      if ((UVar2 == '\0') && (UVar2 = isHangulLVT(this,decomp._6_2_), UVar2 == '\0')) {
        puVar4 = getMapping(this,decomp._6_2_);
        *length = *puVar4 & 0x1f;
        return (UChar *)(puVar4 + 1);
      }
      iVar3 = Hangul::decompose(buffer_local._4_4_,buffer);
      *length = iVar3;
      return buffer;
    }
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *
Normalizer2Impl::getDecomposition(UChar32 c, UChar buffer[4], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isMaybeOrNonZeroCC(norm16=getNorm16(c))) {
        // c does not decompose
        return nullptr;
    }
    const UChar *decomp = nullptr;
    if(isDecompNoAlgorithmic(norm16)) {
        // Maps to an isCompYesAndZeroCC.
        c=mapAlgorithmic(c, norm16);
        decomp=buffer;
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        // The mapping might decompose further.
        norm16 = getRawNorm16(c);
    }
    if (norm16 < minYesNo) {
        return decomp;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        length=Hangul::decompose(c, buffer);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    length=*mapping&MAPPING_LENGTH_MASK;
    return (const UChar *)mapping+1;
}